

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O0

size_t __thiscall
std::hash<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::operator()
          (hash<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *this,
          AlgebraicExpression<mp::QuadAndLinTerms> *x)

{
  size_t sVar1;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_RSI;
  QuadAndLinTerms *in_RDI;
  double *v;
  hash<mp::QuadAndLinTerms> *unaff_retaddr;
  HashStreamer hs;
  unsigned_long *in_stack_ffffffffffffffc8;
  HashStreamerCombine *in_stack_ffffffffffffffd0;
  HashStreamerCombine local_20;
  AlgebraicExpression<mp::QuadAndLinTerms> *local_10;
  
  local_10 = in_RSI;
  mp::HashStreamerCombine::HashStreamerCombine(&local_20,0);
  mp::AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(local_10);
  hash<mp::QuadAndLinTerms>::operator()(unaff_retaddr,in_RDI);
  mp::HashStreamerCombine::Add<unsigned_long>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  v = (double *)mp::AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(local_10);
  mp::HashStreamerCombine::Add<double>(in_stack_ffffffffffffffd0,v);
  sVar1 = mp::HashStreamerCombine::FinalizeHashValue(&local_20);
  return sVar1;
}

Assistant:

size_t operator()(
      const mp::AlgebraicExpression<Body>& x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Body>{}(x.GetBody()));
    hs.Add(x.constant_term());
    return hs.FinalizeHashValue();
  }